

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port_tests.cpp
# Opt level: O0

void __thiscall
iu_PortableTest_x_iutest_x_FileStat_Test::Body(iu_PortableTest_x_iutest_x_FileStat_Test *this)

{
  bool bVar1;
  char *message;
  type **in_stack_fffffffffffffd48;
  AssertionHelper local_298;
  Fixed local_268;
  int local_d0;
  char local_cc [4];
  undefined1 local_c8 [8];
  AssertionResult iutest_ar;
  StatStruct st;
  iu_PortableTest_x_iutest_x_FileStat_Test *this_local;
  
  iutest::detail::AlwaysZero();
  local_cc[0] = '\0';
  local_cc[1] = '\0';
  local_cc[2] = '\0';
  local_cc[3] = '\0';
  local_d0 = iutest::internal::posix::FileStat(0,(StatStruct *)&iutest_ar.m_result);
  iutest::internal::backward::EqHelper<true>::Compare<int,int>
            ((AssertionResult *)local_c8,(EqHelper<true> *)0x14b47f,
             "::iutest::internal::posix::FileStat(0, &st)",local_cc,&local_d0,
             (int *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffd48);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    memset(&local_268,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_268);
    message = iutest::AssertionResult::message((AssertionResult *)local_c8);
    iutest::AssertionHelper::AssertionHelper
              (&local_298,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/port_tests.cpp"
               ,0x31,message,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_298,&local_268);
    iutest::AssertionHelper::~AssertionHelper(&local_298);
    iutest::AssertionHelper::Fixed::~Fixed(&local_268);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  return;
}

Assistant:

IUTEST(PortableTest, FileStat)
{
    ::iutest::internal::posix::StatStruct st;
    IUTEST_ASSERT_EQ(0, ::iutest::internal::posix::FileStat(0, &st));
}